

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

NodePtr __thiscall dh::analysis::compound_stmt(analysis *this)

{
  shared_ptr<dh::TreeNode> *this_00;
  TYPE TVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  analysis *in_RSI;
  bool bVar5;
  NodePtr NVar6;
  bool local_20d;
  bool local_1e9;
  allocator local_191;
  string local_190 [32];
  undefined1 local_170 [8];
  NodePtr tmp_in_ptr_1;
  byte local_131;
  undefined1 local_130 [32];
  undefined1 local_110 [63];
  byte local_d1;
  undefined1 local_d0 [48];
  undefined1 local_a0 [8];
  NodePtr tmp_in_ptr;
  NodePtr tmp_cur_ptr;
  allocator local_69;
  string local_68 [32];
  int local_48 [5];
  int local_34;
  undefined1 local_30 [8];
  NodePtr tmp_ptr;
  analysis *this_local;
  NodePtr *ret;
  
  tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->tmp);
  tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       token::getLineno(peVar2);
  std::make_shared<dh::TreeNode,char_const(&)[3],int>((char (*) [3])this,(int *)"{}");
  std::shared_ptr<dh::TreeNode>::shared_ptr((shared_ptr<dh::TreeNode> *)local_30,(nullptr_t)0x0);
  peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  local_34 = 4;
  TreeNode::setNodeKind(peVar3,&local_34);
  peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  local_48[0] = 0;
  TreeNode::setKind(peVar3,local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"{",&local_69);
  match(in_RSI,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->tmp);
  TVar1 = token::getType(peVar2);
  if (TVar1 != INT) {
    peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &in_RSI->tmp);
    TVar1 = token::getType(peVar2);
    if (TVar1 != VOID) {
      peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&in_RSI->tmp);
      TVar1 = token::getType(peVar2);
      if (TVar1 != FLOAT) {
        peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&in_RSI->tmp);
        TVar1 = token::getType(peVar2);
        if (TVar1 != BOOLEAN) goto LAB_00135aa6;
      }
    }
  }
  var_decl((analysis *)
           &tmp_cur_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<dh::TreeNode>::operator=
            ((shared_ptr<dh::TreeNode> *)local_30,
             (shared_ptr<dh::TreeNode> *)
             &tmp_cur_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<dh::TreeNode>::~shared_ptr
            ((shared_ptr<dh::TreeNode> *)
             &tmp_cur_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_00135aa6:
  std::shared_ptr<dh::TreeNode>::shared_ptr
            ((shared_ptr<dh::TreeNode> *)
             &tmp_in_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<dh::TreeNode> *)local_30);
  while( true ) {
    peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &in_RSI->tmp);
    TVar1 = token::getType(peVar2);
    bVar5 = true;
    if (TVar1 != INT) {
      peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&in_RSI->tmp);
      TVar1 = token::getType(peVar2);
      bVar5 = true;
      if (TVar1 != VOID) {
        peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&in_RSI->tmp);
        TVar1 = token::getType(peVar2);
        bVar5 = true;
        if (TVar1 != FLOAT) {
          peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&in_RSI->tmp);
          TVar1 = token::getType(peVar2);
          bVar5 = TVar1 == BOOLEAN;
        }
      }
    }
    if (!bVar5) break;
    var_decl((analysis *)local_a0);
    peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&tmp_in_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    TreeNode::setSibling(peVar3,(NodePtr *)local_a0);
    std::shared_ptr<dh::TreeNode>::operator=
              ((shared_ptr<dh::TreeNode> *)
               &tmp_in_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<dh::TreeNode> *)local_a0);
    std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_a0);
  }
  peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  TreeNode::appendChild(peVar3,(NodePtr *)local_30);
  this_00 = (shared_ptr<dh::TreeNode> *)(local_d0 + 0x20);
  std::shared_ptr<dh::TreeNode>::shared_ptr(this_00,(nullptr_t)0x0);
  std::shared_ptr<dh::TreeNode>::operator=((shared_ptr<dh::TreeNode> *)local_30,this_00);
  std::shared_ptr<dh::TreeNode>::~shared_ptr(this_00);
  peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &in_RSI->tmp);
  local_d1 = 0;
  local_110[0x17] = 0;
  TVar1 = token::getType(peVar2);
  local_1e9 = true;
  if (TVar1 != BREAK) {
    peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &in_RSI->tmp);
    TVar1 = token::getType(peVar2);
    local_1e9 = true;
    if (TVar1 != RETURN) {
      peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&in_RSI->tmp);
      TVar1 = token::getType(peVar2);
      local_1e9 = true;
      if (TVar1 != IF) {
        peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&in_RSI->tmp);
        TVar1 = token::getType(peVar2);
        local_1e9 = true;
        if (TVar1 != CONTINUE) {
          peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&in_RSI->tmp);
          TVar1 = token::getType(peVar2);
          local_1e9 = true;
          if (TVar1 != FOR) {
            peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&in_RSI->tmp);
            TVar1 = token::getType(peVar2);
            local_1e9 = true;
            if (TVar1 != WHILE) {
              peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&in_RSI->tmp);
              TVar1 = token::getType(peVar2);
              local_1e9 = true;
              if (TVar1 != ID) {
                std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&in_RSI->tmp);
                token::getVal_abi_cxx11_((token *)local_d0);
                local_d1 = 1;
                bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_d0,"{");
                local_1e9 = true;
                if (!bVar5) {
                  std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&in_RSI->tmp);
                  token::getVal_abi_cxx11_((token *)(local_110 + 0x18));
                  local_110[0x17] = 1;
                  local_1e9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(local_110 + 0x18),"(");
                }
              }
            }
          }
        }
      }
    }
  }
  if ((local_110[0x17] & 1) != 0) {
    std::__cxx11::string::~string((string *)(local_110 + 0x18));
  }
  if ((local_d1 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_d0);
  }
  if (local_1e9 != false) {
    stmt((analysis *)local_110);
    std::shared_ptr<dh::TreeNode>::operator=
              ((shared_ptr<dh::TreeNode> *)local_30,(shared_ptr<dh::TreeNode> *)local_110);
    std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_110);
  }
  std::shared_ptr<dh::TreeNode>::operator=
            ((shared_ptr<dh::TreeNode> *)
             &tmp_in_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<dh::TreeNode> *)local_30);
  while( true ) {
    peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &in_RSI->tmp);
    local_131 = 0;
    tmp_in_ptr_1.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _7_1_ = 0;
    TVar1 = token::getType(peVar2);
    local_20d = true;
    if (TVar1 != BREAK) {
      peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&in_RSI->tmp);
      TVar1 = token::getType(peVar2);
      local_20d = true;
      if (TVar1 != RETURN) {
        peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&in_RSI->tmp);
        TVar1 = token::getType(peVar2);
        local_20d = true;
        if (TVar1 != IF) {
          peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&in_RSI->tmp);
          TVar1 = token::getType(peVar2);
          local_20d = true;
          if (TVar1 != CONTINUE) {
            peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&in_RSI->tmp);
            TVar1 = token::getType(peVar2);
            local_20d = true;
            if (TVar1 != FOR) {
              peVar2 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&in_RSI->tmp);
              TVar1 = token::getType(peVar2);
              local_20d = true;
              if (TVar1 != WHILE) {
                peVar2 = std::
                         __shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                         operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&in_RSI->tmp);
                TVar1 = token::getType(peVar2);
                local_20d = true;
                if (TVar1 != ID) {
                  std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&in_RSI->tmp);
                  token::getVal_abi_cxx11_((token *)local_130);
                  local_131 = 1;
                  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_130,"{");
                  local_20d = true;
                  if (!bVar5) {
                    std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&in_RSI->tmp);
                    token::getVal_abi_cxx11_((token *)&stack0xfffffffffffffea8);
                    tmp_in_ptr_1.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._7_1_ = 1;
                    local_20d = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&stack0xfffffffffffffea8,"(");
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((tmp_in_ptr_1.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         ._7_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
    }
    if ((local_131 & 1) != 0) {
      std::__cxx11::string::~string((string *)local_130);
    }
    if (local_20d == false) break;
    stmt((analysis *)local_170);
    peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&tmp_in_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    TreeNode::setSibling(peVar3,(NodePtr *)local_170);
    std::shared_ptr<dh::TreeNode>::operator=
              ((shared_ptr<dh::TreeNode> *)
               &tmp_in_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<dh::TreeNode> *)local_170);
    std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_170);
  }
  peVar3 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  TreeNode::appendChild(peVar3,(NodePtr *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"}",&local_191);
  match(in_RSI,(string *)local_190);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
  std::shared_ptr<dh::TreeNode>::~shared_ptr
            ((shared_ptr<dh::TreeNode> *)
             &tmp_in_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)local_30);
  _Var4._M_pi = extraout_RDX;
  if ((tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
      & 1) == 0) {
    std::shared_ptr<dh::TreeNode>::~shared_ptr((shared_ptr<dh::TreeNode> *)this);
    _Var4._M_pi = extraout_RDX_00;
  }
  NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi
  ;
  NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::compound_stmt()
{
#ifdef _DEBGU_
	::std::cout << "[DEBUG] in compound_stmt \n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>("{}",tmp->getLineno());
	NodePtr tmp_ptr = nullptr;
	ret->setNodeKind(NodeKind::StmtK);
	ret->setKind(StmtKind::ComK);

	match("{");

	if ( tmp->getType() == TYPE::INT
			|| tmp->getType() == TYPE::VOID
			|| tmp->getType() == TYPE::FLOAT
			|| tmp->getType() == TYPE::BOOLEAN)
	{
		tmp_ptr = var_decl();
	}

	NodePtr tmp_cur_ptr = tmp_ptr;
	while(tmp->getType() == TYPE::INT
			|| tmp->getType() == TYPE::VOID
			|| tmp->getType() == TYPE::FLOAT
			|| tmp->getType() == TYPE::BOOLEAN)
	{
		NodePtr tmp_in_ptr = var_decl();
		tmp_cur_ptr->setSibling(tmp_in_ptr);
		tmp_cur_ptr = tmp_in_ptr;
	}
	ret->appendChild(tmp_ptr);

	tmp_ptr = nullptr;
	if ( tmp->getType() == TYPE::BREAK
			|| tmp->getType() == TYPE::RETURN
			|| tmp->getType() == TYPE::IF
			|| tmp->getType() == TYPE::CONTINUE
			|| tmp->getType() == TYPE::FOR
			|| tmp->getType() == TYPE::WHILE
			|| tmp->getType() == TYPE::ID
			|| tmp->getVal() == "{"
			|| tmp->getVal() == "(")
	{
		tmp_ptr = stmt();
	}

	tmp_cur_ptr = tmp_ptr;
	while ( tmp->getType() == TYPE::BREAK
			|| tmp->getType() == TYPE::RETURN
			|| tmp->getType() == TYPE::IF
			|| tmp->getType() == TYPE::CONTINUE
			|| tmp->getType() == TYPE::FOR
			|| tmp->getType() == TYPE::WHILE
			|| tmp->getType() == TYPE::ID
			|| tmp->getVal() == "{"
			|| tmp->getVal() == "(")
	{
		NodePtr tmp_in_ptr = stmt();
		tmp_cur_ptr->setSibling(tmp_in_ptr);
		tmp_cur_ptr = tmp_in_ptr;
	}
	ret->appendChild(tmp_ptr);

	match("}");

	return ret;
}